

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O3

void t3cbf(int gpio,int level,uint32_t tick,void *userdata)

{
  if (*userdata != 0x1167535) {
    if (t3cbf_unreported == '\0') {
      fprintf(_stderr,"unexpected userdata %d (expected %d)\n",(ulong)*userdata,0x1167535);
    }
    t3cbf_unreported = '\x01';
  }
  if (t3_reset == 0) {
    if (level == 0) {
      t3_on = (float)(tick - t3_tick) + t3_on;
    }
    else {
      t3_off = (float)(tick - t3_tick) + t3_off;
    }
  }
  else {
    t3_count = 0;
    t3_on = 0.0;
    t3_off = 0.0;
    t3_reset = 0;
  }
  t3_count = t3_count + 1;
  t3_tick = tick;
  return;
}

Assistant:

void t3cbf(int gpio, int level, uint32_t tick, void *userdata)
{
   static int unreported = 1;

   uint32_t td;
   int *val;

   val = userdata;

   if (*val != USERDATA)
   {
      if (unreported)
      {
         fprintf
         (
            stderr,
            "unexpected userdata %d (expected %d)\n",
            *val, USERDATA
         );
      }
      unreported = 0;
   }

   if (t3_reset)
   {
      t3_count = 0;
      t3_on = 0.0;
      t3_off = 0.0;
      t3_reset = 0;
   }
   else
   {
      td = tick - t3_tick;

      if (level == 0) t3_on += td;
      else            t3_off += td;
   }

   t3_count ++;
   t3_tick = tick;
}